

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::SetNumericProperty
          (JSONStringifier *this,double value,Var valueVar,JSONProperty *prop)

{
  bool bVar1;
  charcount_t rhs;
  uint32 uVar2;
  JavascriptString *pJVar3;
  JSONProperty *prop_local;
  Var valueVar_local;
  double value_local;
  JSONStringifier *this_local;
  
  bVar1 = NumberUtilities::IsFinite(value);
  if (bVar1) {
    prop->type = Number;
    Memory::WriteBarrierPtr<void>::operator=(&(prop->field_1).numericValue.value,valueVar);
    pJVar3 = JavascriptConversion::ToString(valueVar,this->scriptContext);
    Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
              (&(prop->field_1).numericValue.string,pJVar3);
    uVar2 = this->totalStringLength;
    pJVar3 = Memory::WriteBarrierPtr<Js::JavascriptString>::operator->
                       (&(prop->field_1).numericValue.string);
    rhs = JavascriptString::GetLength(pJVar3);
    uVar2 = UInt32Math::Add(uVar2,rhs);
    this->totalStringLength = uVar2;
  }
  else {
    SetNullProperty(this,prop);
  }
  return;
}

Assistant:

void
JSONStringifier::SetNumericProperty(double value, _In_ Var valueVar, _Out_ JSONProperty* prop)
{
    if (NumberUtilities::IsFinite(value))
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = valueVar;
        prop->numericValue.string = JavascriptConversion::ToString(valueVar, this->scriptContext);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
    }
    else
    {
        this->SetNullProperty(prop);
    }
}